

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

void vocerr_info(voccxdef *ctx,int err,char *f,...)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  vocerr_va_info info;
  va_list argptr;
  __va_list_tag *argptr_00;
  char *f_00;
  int err_00;
  vocerr_va_info *in_stack_fffffffffffffd68;
  voccxdef *in_stack_fffffffffffffd70;
  char local_1e0 [48];
  __va_list_tag *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe64;
  vocerr_va_info *in_stack_fffffffffffffe68;
  voccxdef *in_stack_fffffffffffffe70;
  undefined4 local_38;
  undefined4 local_34;
  __va_list_tag *local_30;
  undefined1 *local_28;
  undefined8 local_18;
  undefined4 local_c;
  undefined8 local_8;
  
  argptr_00 = (__va_list_tag *)&stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x18;
  f_00 = local_1e0;
  err_00 = (int)((ulong)&local_38 >> 0x20);
  local_30 = argptr_00;
  local_28 = &stack0xfffffffffffffd68;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  vocerr_va_prep(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                 in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  local_34 = 0x30;
  local_38 = 0x18;
  local_30 = argptr_00;
  local_28 = &stack0xfffffffffffffd68;
  vocerr_va(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,err_00,f_00,argptr_00);
  return;
}

Assistant:

void vocerr_info(voccxdef *ctx, int err, char *f, ...)
{
    va_list argptr;
    struct vocerr_va_info info;

    /* prepare to format the message */
    va_start(argptr, f);
    vocerr_va_prep(ctx, &info, err, f, argptr);
    va_end(argptr);

   /* call the general vocerr formatter */
    va_start(argptr, f);
    vocerr_va(ctx, &info, err, f, argptr);
    va_end(argptr);
}